

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

QDomNodePrivate * __thiscall
QDomNodePrivate::insertAfter
          (QDomNodePrivate *this,QDomNodePrivate *newChild,QDomNodePrivate *refChild)

{
  QDomNodePrivate **ppQVar1;
  QDomNodePrivate *pQVar2;
  QDomNodePrivate *pQVar3;
  int iVar4;
  QDomDocumentPrivate *pQVar5;
  QDomNodePrivate *pQVar6;
  
  if (newChild == refChild || newChild == (QDomNodePrivate *)0x0) {
    return (QDomNodePrivate *)0x0;
  }
  if (refChild != (QDomNodePrivate *)0x0) {
    if ((refChild->field_0x98 & 2) == 0) {
      return (QDomNodePrivate *)0x0;
    }
    if (refChild->ownerNode != this) {
      return (QDomNodePrivate *)0x0;
    }
  }
  pQVar5 = ownerDocument(this);
  if (pQVar5 != (QDomDocumentPrivate *)0x0) {
    pQVar5->nodeListTime = pQVar5->nodeListTime + 1;
  }
  iVar4 = (*newChild->_vptr_QDomNodePrivate[0xb])(newChild);
  if (iVar4 != 0xb) {
    pQVar6 = newChild->ownerNode;
    if (pQVar6 != (QDomNodePrivate *)0x0 && (newChild->field_0x98 & 2) != 0) {
      (*pQVar6->_vptr_QDomNodePrivate[6])(pQVar6,newChild);
    }
    LOCK();
    (newChild->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (newChild->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    newChild->field_0x98 = newChild->field_0x98 | 2;
    newChild->ownerNode = this;
    if ((refChild != (QDomNodePrivate *)0x0) &&
       (pQVar6 = refChild->next, pQVar6 != (QDomNodePrivate *)0x0)) {
      newChild->prev = refChild;
      newChild->next = pQVar6;
      refChild->next->prev = newChild;
      refChild->next = newChild;
      return newChild;
    }
    pQVar6 = this->last;
    if (pQVar6 != (QDomNodePrivate *)0x0) {
      pQVar6->next = newChild;
    }
    newChild->prev = pQVar6;
    if (this->first == (QDomNodePrivate *)0x0) {
      this->first = newChild;
    }
    this->last = newChild;
    return newChild;
  }
  pQVar6 = newChild->first;
  if (pQVar6 == (QDomNodePrivate *)0x0) {
    return newChild;
  }
  ppQVar1 = &newChild->first;
  for (; pQVar6 != (QDomNodePrivate *)0x0; pQVar6 = pQVar6->next) {
    pQVar6->ownerNode = this;
    pQVar6->field_0x98 = pQVar6->field_0x98 | 2;
  }
  if (refChild == (QDomNodePrivate *)0x0) {
    pQVar6 = *ppQVar1;
  }
  else {
    pQVar2 = refChild->next;
    pQVar6 = *ppQVar1;
    if (pQVar2 != (QDomNodePrivate *)0x0) {
      pQVar6->prev = refChild;
      pQVar3 = newChild->last;
      pQVar3->next = pQVar2;
      refChild->next->prev = pQVar3;
      refChild->next = pQVar6;
      goto LAB_0010dd5f;
    }
  }
  pQVar2 = this->last;
  if (pQVar2 != (QDomNodePrivate *)0x0) {
    pQVar2->next = pQVar6;
  }
  pQVar6->prev = pQVar2;
  if (this->first == (QDomNodePrivate *)0x0) {
    this->first = pQVar6;
  }
  this->last = newChild->last;
LAB_0010dd5f:
  *ppQVar1 = (QDomNodePrivate *)0x0;
  newChild->last = (QDomNodePrivate *)0x0;
  return newChild;
}

Assistant:

QDomNodePrivate* QDomNodePrivate::insertAfter(QDomNodePrivate* newChild, QDomNodePrivate* refChild)
{
    // Error check
    if (!newChild)
        return nullptr;

    // Error check
    if (newChild == refChild)
        return nullptr;

    // Error check
    if (refChild && refChild->parent() != this)
        return nullptr;

    // "mark lists as dirty"
    QDomDocumentPrivate *const doc = ownerDocument();
    if (doc)
        doc->nodeListTime++;

    // Special handling for inserting a fragment. We just insert
    // all elements of the fragment instead of the fragment itself.
    if (newChild->isDocumentFragment()) {
        // Fragment is empty ?
        if (newChild->first == nullptr)
            return newChild;

        // New parent
        QDomNodePrivate* n = newChild->first;
        while (n) {
            n->setParent(this);
            n = n->next;
        }

        // Insert at the end
        if (!refChild || refChild->next == nullptr) {
            if (last)
                last->next = newChild->first;
            newChild->first->prev = last;
            if (!first)
                first = newChild->first;
            last = newChild->last;
        } else { // Insert in the middle
            newChild->first->prev = refChild;
            newChild->last->next = refChild->next;
            refChild->next->prev = newChild->last;
            refChild->next = newChild->first;
        }

        // No need to increase the reference since QDomDocumentFragment
        // does not decrease the reference.

        // Remove the nodes from the fragment
        newChild->first = nullptr;
        newChild->last = nullptr;
        return newChild;
    }

    // Release new node from its current parent
    if (newChild->parent())
        newChild->parent()->removeChild(newChild);

    // No more errors can occur now, so we take
    // ownership of the node
    newChild->ref.ref();

    newChild->setParent(this);

    // Insert at the end
    if (!refChild) {
        if (last)
            last->next = newChild;
        newChild->prev = last;
        if (!first)
            first = newChild;
        last = newChild;
        return newChild;
    }

    if (refChild->next == nullptr) {
        if (last)
            last->next = newChild;
        newChild->prev = last;
        if (!first)
            first = newChild;
        last = newChild;
        return newChild;
    }

    newChild->prev = refChild;
    newChild->next = refChild->next;
    refChild->next->prev = newChild;
    refChild->next = newChild;

    return newChild;
}